

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

_Bool apply_paint(render_state_t *state,render_context_t *context,paint_t *paint)

{
  paint_type_t pVar1;
  render_state_t *prVar2;
  _Bool _Var3;
  element_t *peVar4;
  element_t *peVar5;
  attribute *paVar6;
  int i;
  int iVar7;
  uint uVar8;
  gradient_stop_array_t *color;
  plutovg_canvas_t *canvas;
  element_t *peVar9;
  element_t *peVar10;
  uint uVar11;
  float fVar12;
  uint uVar13;
  float fVar14;
  uint uVar15;
  float fVar16;
  uint uVar17;
  float fVar18;
  undefined4 uVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float cr;
  undefined1 auVar27 [16];
  length_t fx;
  length_t x2;
  length_t y1;
  plutovg_spread_method_t spread;
  units_type_t units;
  length_t x1;
  plutovg_spread_method_t spread_1;
  plutovg_matrix_t transform;
  gradient_stop_array_t stops;
  length_t local_608;
  length_t local_600;
  length_t local_5f8;
  units_type_t local_5ec;
  length_t local_5e8;
  length_t local_5e0;
  render_state_t *local_5d8;
  plutovg_spread_method_t local_5cc;
  gradient_attributes_t local_5c8;
  element_t *local_5a8;
  element_t *peStack_5a0;
  element_t *local_598;
  element_t *peStack_590;
  element_t *local_588;
  undefined1 local_578 [16];
  element_t *local_568;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  plutovg_matrix_t local_558;
  gradient_stop_array_t local_538;
  
  pVar1 = paint->type;
  if (pVar1 == paint_type_none) {
    uVar8 = 0;
  }
  else {
    if (pVar1 == paint_type_var) {
      if ((context->palette_func == (plutosvg_palette_func_t)0x0) ||
         (_Var3 = (*context->palette_func)
                            (context->closure,(paint->id).data,(int)(paint->id).length,
                             (plutovg_color_t *)&local_5c8), !_Var3)) {
        if ((paint->color).type == color_type_fixed) {
          plutovg_color_init_argb32((plutovg_color_t *)&local_538,(paint->color).value);
          local_5c8._0_16_ = local_538.data[0]._0_16_;
        }
        else {
          local_5c8._0_16_ = resolve_current_color(context,state->element);
        }
      }
      canvas = context->canvas;
      color = (gradient_stop_array_t *)&local_5c8;
    }
    else {
      if ((pVar1 != paint_type_color) &&
         (peVar4 = find_element((plutosvg_document_t *)context->document->id_cache,&paint->id),
         peVar4 != (element_t *)0x0)) {
        uVar8 = 0;
        uVar22 = (undefined4)((ulong)peVar4 >> 0x20);
        local_5d8 = state;
        if (peVar4->id == 0xc) {
          local_598 = (element_t *)0x0;
          peStack_590 = (element_t *)0x0;
          local_5a8 = (element_t *)0x0;
          peStack_5a0 = (element_t *)0x0;
          local_5c8.transform = (element_t *)0x0;
          local_5c8.stops = (element_t *)0x0;
          local_5c8._0_16_ = ZEXT816(0);
          local_588 = (element_t *)0x0;
          peVar5 = peVar4;
          do {
            collect_gradient_attributes(peVar5,&local_5c8);
            peVar9 = local_588;
            if (peVar5->id == 0xc) {
              peVar10 = local_5a8;
              if (local_5a8 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar10 = local_5a8, paVar6 != (attribute *)0x0 &&
                    (peVar10 = peVar5, paVar6->id != 5)); paVar6 = paVar6->next) {
                }
              }
              local_5a8 = peVar10;
              peVar10 = peStack_5a0;
              if (peStack_5a0 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar10 = peStack_5a0, paVar6 != (attribute *)0x0 &&
                    (peVar10 = peVar5, paVar6->id != 6)); paVar6 = paVar6->next) {
                }
              }
              peStack_5a0 = peVar10;
              peVar10 = local_598;
              if (local_598 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar10 = local_598, paVar6 != (attribute *)0x0 &&
                    (peVar10 = peVar5, paVar6->id != 0x17)); paVar6 = paVar6->next) {
                }
              }
              local_598 = peVar10;
              peVar10 = peStack_590;
              if (peStack_590 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar10 = peStack_590, paVar6 != (attribute *)0x0 &&
                    (peVar10 = peVar5, paVar6->id != 0xc)); paVar6 = paVar6->next) {
                }
              }
              peStack_590 = peVar10;
              if (local_588 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar9 = local_588, paVar6 != (attribute *)0x0 &&
                    (peVar9 = peVar5, paVar6->id != 0xd)); paVar6 = paVar6->next) {
                }
              }
            }
            local_588 = peVar9;
            peVar5 = resolve_href(context->document,peVar5);
          } while (((peVar5 != (element_t *)0x0) && ((peVar5->id | 4U) == 0xc)) &&
                  (uVar8 = uVar8 + 1, uVar8 != 0x80));
          uVar8 = (uint)(local_5c8.stops != (element_t *)0x0);
          if (local_5c8.stops != (element_t *)0x0) {
            auVar26._0_4_ = -(uint)((int)local_5c8.units == 0);
            auVar26._4_4_ = -(uint)(local_5c8.units._4_4_ == 0);
            auVar26._8_4_ = -(uint)((int)local_5c8.spread == 0);
            auVar26._12_4_ = -(uint)(local_5c8.spread._4_4_ == 0);
            auVar24._4_4_ = auVar26._0_4_;
            auVar24._0_4_ = auVar26._4_4_;
            auVar24._8_4_ = auVar26._12_4_;
            auVar24._12_4_ = auVar26._8_4_;
            auVar21._8_4_ = (int)peVar4;
            auVar21._0_8_ = peVar4;
            auVar21._12_4_ = uVar22;
            local_5c8._0_16_ =
                 ~(auVar24 & auVar26) & (undefined1  [16])local_5c8._0_16_ |
                 auVar21 & auVar24 & auVar26;
            if (local_5c8.transform == (element_t *)0x0) {
              local_5c8.transform = peVar4;
            }
            peVar5 = local_5a8;
            if (local_5a8 == (element_t *)0x0) {
              peVar5 = peVar4;
            }
            peVar9 = peStack_5a0;
            if (peStack_5a0 == (element_t *)0x0) {
              peVar9 = peVar4;
            }
            peVar10 = local_598;
            if (local_598 == (element_t *)0x0) {
              peVar10 = peVar4;
            }
            local_5ec = units_type_object_bounding_box;
            local_5cc = PLUTOVG_SPREAD_METHOD_PAD;
            local_558.a = 1.0;
            local_558.b = 0.0;
            local_558.c = 0.0;
            local_558.d = 1.0;
            local_558.e = 0.0;
            local_558.f = 0.0;
            local_5a8 = peVar5;
            peStack_5a0 = peVar9;
            local_598 = peVar10;
            memset(&local_538,0,0x508);
            resolve_gradient_attributes
                      (context,local_5d8,&local_5c8,&local_5ec,&local_5cc,&local_558,&local_538);
            local_5e0.value = 50.0;
            local_5e0.type = length_type_percent;
            local_5f8.value = 50.0;
            local_5f8.type = length_type_percent;
            local_600.value = 50.0;
            local_600.type = length_type_percent;
            local_608.value = 50.0;
            local_608.type = length_type_percent;
            local_5e8.value = 50.0;
            local_5e8.type = length_type_percent;
            parse_length(peVar5,5,&local_5e0,true,false);
            local_578._0_8_ = peVar9;
            parse_length(peVar9,6,&local_5f8,true,false);
            parse_length(peVar10,0x17,&local_600,false,false);
            if (peStack_590 == (element_t *)0x0) {
              iVar7 = 5;
            }
            else {
              iVar7 = 0xc;
              peVar5 = peStack_590;
            }
            parse_length(peVar5,iVar7,&local_608,true,false);
            prVar2 = local_5d8;
            if (local_588 == (element_t *)0x0) {
              iVar7 = 6;
              peVar4 = (element_t *)local_578._0_8_;
            }
            else {
              iVar7 = 0xd;
              peVar4 = local_588;
            }
            parse_length(peVar4,iVar7,&local_5e8,true,false);
            if (local_5ec == units_type_user_space_on_use) {
              fVar14 = local_5e0.value;
              if (local_5e0.type == length_type_percent) {
                fVar14 = (prVar2->view_width * local_5e0.value) / 100.0;
              }
              fVar16 = local_5f8.value;
              if (local_5f8.type == length_type_percent) {
                fVar16 = (prVar2->view_height * local_5f8.value) / 100.0;
              }
              cr = local_600.value;
              if (local_600.type == length_type_percent) {
                local_568 = (element_t *)(ulong)(uint)fVar16;
                uStack_560 = 0.0;
                uStack_55c = 0.0;
                local_578 = ZEXT416((uint)fVar14);
                fVar12 = hypotf(prVar2->view_width,prVar2->view_height);
                cr = ((fVar12 / 1.4142135) * local_600.value) / 100.0;
                fVar16 = local_568._0_4_;
                fVar14 = (float)local_578._0_4_;
              }
              fVar18 = local_608.value;
              if (local_608.type == length_type_percent) {
                fVar18 = (prVar2->view_width * local_608.value) / 100.0;
              }
              fVar12 = local_5e8.value;
              if (local_5e8.type == length_type_percent) {
                fVar12 = (prVar2->view_height * local_5e8.value) / 100.0;
              }
            }
            else {
              auVar27._4_4_ = local_5f8.value;
              auVar27._0_4_ = local_5e0.value;
              auVar27._8_4_ = local_600.value;
              auVar27._12_4_ = local_608.value;
              auVar26 = divps(auVar27,_DAT_00129160);
              uVar11 = (int)((uint)(local_5e0.type == length_type_percent) << 0x1f) >> 0x1f;
              uVar13 = (int)((uint)(local_5f8.type == length_type_percent) << 0x1f) >> 0x1f;
              uVar15 = (int)((uint)(local_600.type == length_type_percent) * -0x80000000) >> 0x1f;
              uVar17 = (int)((uint)(local_608.type == length_type_percent) * -0x80000000) >> 0x1f;
              fVar12 = local_5e8.value;
              if (local_5e8.type == length_type_percent) {
                fVar12 = local_5e8.value / 100.0;
              }
              fVar14 = (float)(auVar26._0_4_ & uVar11 | ~uVar11 & (uint)local_5e0.value);
              fVar16 = (float)(auVar26._4_4_ & uVar13 | ~uVar13 & (uint)local_5f8.value);
              cr = (float)(auVar26._8_4_ & uVar15 | ~uVar15 & (uint)local_600.value);
              fVar18 = (float)(auVar26._12_4_ & uVar17 | ~uVar17 & (uint)local_608.value);
            }
            plutovg_canvas_set_radial_gradient
                      (context->canvas,fVar14,fVar16,cr,fVar18,fVar12,0.0,local_5cc,local_538.data,
                       (int)local_538.size,&local_558);
          }
        }
        else if (peVar4->id == 8) {
          local_598 = (element_t *)0x0;
          peStack_590 = (element_t *)0x0;
          local_5a8 = (element_t *)0x0;
          peStack_5a0 = (element_t *)0x0;
          local_5c8.transform = (element_t *)0x0;
          local_5c8.stops = (element_t *)0x0;
          local_5c8._0_16_ = ZEXT816(0);
          iVar7 = 0;
          peVar5 = peVar4;
          do {
            collect_gradient_attributes(peVar5,&local_5c8);
            peVar9 = peStack_590;
            if (peVar5->id == 8) {
              peVar10 = local_5a8;
              if (local_5a8 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar10 = local_5a8, paVar6 != (attribute *)0x0 &&
                    (peVar10 = peVar5, paVar6->id != 0x2b)); paVar6 = paVar6->next) {
                }
              }
              local_5a8 = peVar10;
              peVar10 = peStack_5a0;
              if (peStack_5a0 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar10 = peStack_5a0, paVar6 != (attribute *)0x0 &&
                    (peVar10 = peVar5, paVar6->id != 0x2e)); paVar6 = paVar6->next) {
                }
              }
              peStack_5a0 = peVar10;
              peVar10 = local_598;
              if (local_598 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar10 = local_598, paVar6 != (attribute *)0x0 &&
                    (peVar10 = peVar5, paVar6->id != 0x2c)); paVar6 = paVar6->next) {
                }
              }
              local_598 = peVar10;
              if (peStack_590 == (element_t *)0x0) {
                for (paVar6 = peVar5->attributes;
                    (peVar9 = peStack_590, paVar6 != (attribute *)0x0 &&
                    (peVar9 = peVar5, paVar6->id != 0x2f)); paVar6 = paVar6->next) {
                }
              }
            }
            peStack_590 = peVar9;
            peVar5 = resolve_href(context->document,peVar5);
          } while (((peVar5 != (element_t *)0x0) && ((peVar5->id | 4U) == 0xc)) &&
                  (iVar7 = iVar7 + 1, iVar7 != 0x80));
          uVar8 = (uint)(local_5c8.stops != (element_t *)0x0);
          if (local_5c8.stops != (element_t *)0x0) {
            auVar19._0_4_ = -(uint)((int)local_5c8.units == 0);
            auVar19._4_4_ = -(uint)(local_5c8.units._4_4_ == 0);
            auVar19._8_4_ = -(uint)((int)local_5c8.spread == 0);
            auVar19._12_4_ = -(uint)(local_5c8.spread._4_4_ == 0);
            auVar23._4_4_ = auVar19._0_4_;
            auVar23._0_4_ = auVar19._4_4_;
            auVar23._8_4_ = auVar19._12_4_;
            auVar23._12_4_ = auVar19._8_4_;
            auVar20._8_4_ = (int)peVar4;
            auVar20._0_8_ = peVar4;
            auVar20._12_4_ = uVar22;
            local_5c8._0_16_ =
                 ~(auVar23 & auVar19) & (undefined1  [16])local_5c8._0_16_ |
                 auVar20 & auVar23 & auVar19;
            if (local_5c8.transform == (element_t *)0x0) {
              local_5c8.transform = peVar4;
            }
            peVar5 = local_5a8;
            if (local_5a8 == (element_t *)0x0) {
              peVar5 = peVar4;
            }
            peVar9 = peStack_5a0;
            if (peStack_5a0 == (element_t *)0x0) {
              peVar9 = peVar4;
            }
            if (local_598 == (element_t *)0x0) {
              local_598 = peVar4;
            }
            if (peStack_590 == (element_t *)0x0) {
              peStack_590 = peVar4;
            }
            local_578._0_8_ = peStack_590;
            local_5e8 = (length_t)((ulong)local_5e8 & 0xffffffff00000000);
            local_5ec = units_type_object_bounding_box;
            local_558.a = 1.0;
            local_558.b = 0.0;
            local_558.c = 0.0;
            local_558.d = 1.0;
            local_558.e = 0.0;
            local_558.f = 0.0;
            local_5a8 = peVar5;
            peStack_5a0 = peVar9;
            local_568 = local_598;
            memset(&local_538,0,0x508);
            resolve_gradient_attributes
                      (context,local_5d8,&local_5c8,(units_type_t *)&local_5e8,&local_5ec,&local_558
                       ,&local_538);
            local_5e0.value = 0.0;
            local_5e0.type = length_type_fixed;
            local_5f8.value = 0.0;
            local_5f8.type = length_type_fixed;
            local_600.value = 100.0;
            local_600.type = length_type_percent;
            local_608.value = 0.0;
            local_608.type = length_type_fixed;
            parse_length(peVar5,0x2b,&local_5e0,true,false);
            parse_length(peVar9,0x2e,&local_5f8,true,false);
            parse_length(local_568,0x2c,&local_600,true,false);
            parse_length((element_t *)local_578._0_8_,0x2f,&local_608,true,false);
            if (local_5e8.value == 1.4013e-45) {
              fVar12 = local_5e0.value;
              if (local_5e0.type == length_type_percent) {
                fVar12 = (local_5d8->view_width * local_5e0.value) / 100.0;
              }
              fVar14 = local_5f8.value;
              if (local_5f8.type == length_type_percent) {
                fVar14 = (local_5d8->view_height * local_5f8.value) / 100.0;
              }
              fVar16 = local_600.value;
              if (local_600.type == length_type_percent) {
                fVar16 = (local_5d8->view_width * local_600.value) / 100.0;
              }
              fVar18 = local_608.value;
              if (local_608.type == length_type_percent) {
                fVar18 = (local_5d8->view_height * local_608.value) / 100.0;
              }
            }
            else {
              auVar25._4_4_ = local_5f8.value;
              auVar25._0_4_ = local_5e0.value;
              auVar25._8_4_ = local_600.value;
              auVar25._12_4_ = local_608.value;
              auVar26 = divps(auVar25,_DAT_00129160);
              uVar11 = (int)((uint)(local_5e0.type == length_type_percent) << 0x1f) >> 0x1f;
              uVar13 = (int)((uint)(local_5f8.type == length_type_percent) << 0x1f) >> 0x1f;
              uVar15 = (int)((uint)(local_600.type == length_type_percent) * -0x80000000) >> 0x1f;
              uVar17 = (int)((uint)(local_608.type == length_type_percent) * -0x80000000) >> 0x1f;
              fVar12 = (float)(~uVar11 & (uint)local_5e0.value | auVar26._0_4_ & uVar11);
              fVar14 = (float)(~uVar13 & (uint)local_5f8.value | auVar26._4_4_ & uVar13);
              fVar16 = (float)(~uVar15 & (uint)local_600.value | auVar26._8_4_ & uVar15);
              fVar18 = (float)(~uVar17 & (uint)local_608.value | auVar26._12_4_ & uVar17);
            }
            plutovg_canvas_set_linear_gradient
                      (context->canvas,fVar12,fVar14,fVar16,fVar18,local_5ec,local_538.data,
                       (int)local_538.size,&local_558);
          }
        }
        goto LAB_001084eb;
      }
      if ((paint->color).type == color_type_fixed) {
        plutovg_color_init_argb32((plutovg_color_t *)&local_538,(paint->color).value);
      }
      else {
        local_538.data[0]._0_16_ = resolve_current_color(context,state->element);
      }
      color = &local_538;
      canvas = context->canvas;
    }
    plutovg_canvas_set_color(canvas,(plutovg_color_t *)color);
    uVar8 = 1;
  }
LAB_001084eb:
  return SUB41(uVar8,0);
}

Assistant:

static bool apply_paint(render_state_t* state, const render_context_t* context, const paint_t* paint)
{
    if(paint->type == paint_type_none)
        return false;
    if(paint->type == paint_type_color) {
        plutovg_color_t color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    if(paint->type == paint_type_var) {
        plutovg_color_t color;
        if(!context->palette_func || !context->palette_func(context->closure, paint->id.data, paint->id.length, &color))
            color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    const element_t* ref = find_element(context->document, &paint->id);
    if(ref == NULL) {
        plutovg_color_t color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    if(ref->id == TAG_LINEAR_GRADIENT)
        return apply_linear_gradient(state, context, ref);
    if(ref->id == TAG_RADIAL_GRADIENT)
        return apply_radial_gradient(state, context, ref);
    return false;
}